

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageView::removeWidget(PageView *this,QWidget *widget)

{
  PageViewPrivate *pPVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  pPVar1 = (this->d).d;
  lVar2 = (pPVar1->pages).d.size;
  iVar4 = -1;
  if (0 < lVar2) {
    lVar5 = 0;
    do {
      if ((pPVar1->pages).d.ptr[lVar5] == widget) {
        iVar4 = (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  if (iVar4 != -1) {
    QList<QWidget_*>::removeAt(&pPVar1->pages,(long)iVar4);
    QWidget::setParent(widget);
    QWidget::hide();
    iVar3 = PageControl::currentIndex(((this->d).d)->control);
    pPVar1 = (this->d).d;
    PageControl::setCount(pPVar1->control,(int)(pPVar1->pages).d.size);
    if ((iVar4 == iVar3) && (iVar4 = PageControl::currentIndex(((this->d).d)->control), iVar4 != -1)
       ) {
      pPVar1 = (this->d).d;
      iVar4 = PageControl::currentIndex(pPVar1->control);
      PageViewPrivate::showPage(pPVar1,iVar4);
      return;
    }
  }
  return;
}

Assistant:

void
PageView::removeWidget( QWidget * widget )
{
	const int index  = indexOf( widget );

	if( index != -1 )
	{
		d->pages.removeAt( index );

		widget->setParent( 0 );

		widget->hide();

		const bool changePage = index == currentIndex();

		d->control->setCount( d->pages.count() );

		if( changePage && currentIndex() != -1 )
			d->showPage( currentIndex() );
	}
}